

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O1

void __thiscall
RK_Individual::geraPesosConfInicial(RK_Individual *this,int *idsAbertos,int n,Graph *g)

{
  int iVar1;
  double *pdVar2;
  Vertex *pVVar3;
  int iVar4;
  long lVar5;
  Edge *pEVar6;
  ulong uVar7;
  
  iVar4 = this->number_of_edges;
  if (0 < (long)iVar4) {
    pdVar2 = this->weights;
    lVar5 = 0;
    do {
      pdVar2[lVar5] = 1.0;
      lVar5 = lVar5 + 1;
    } while (iVar4 != lVar5);
  }
  pVVar3 = g->verticesList;
  if (pVVar3 != (Vertex *)0x0) {
    iVar4 = 0;
    do {
      for (pEVar6 = pVVar3->edgesList; pEVar6 != (Edge *)0x0; pEVar6 = pEVar6->nextEdge) {
        if ((pEVar6->modifiable == true) && (pEVar6->marked == true)) {
          if (0 < n) {
            iVar1 = pEVar6->id;
            pdVar2 = this->weights;
            uVar7 = 0;
            do {
              if (iVar1 == idsAbertos[uVar7]) {
                pdVar2[iVar4] = 0.0;
              }
              uVar7 = uVar7 + 1;
            } while ((uint)n != uVar7);
          }
          iVar4 = iVar4 + 1;
        }
      }
      pVVar3 = pVVar3->nextVertex;
    } while (pVVar3 != (Vertex *)0x0);
  }
  return;
}

Assistant:

void RK_Individual::geraPesosConfInicial(int *idsAbertos, int n, Graph *g){

//    cout << "vai gerar conf inicial:\n--------------------------------" << endl;

//    cout << "idsAberto = {" << endl;
//    for(int i=0; i<n; i++)
//        cout << idsAbertos[i] << endl;
//    cout << "}" << endl;

    this->resetaPesos(1.0);
    int j=0;
    for(Vertex *no = g->get_verticesList(); no != NULL; no= no->getNext()){

        for(Edge *a = no->getEdgesList(); a != NULL; a= a->getNext()){

            if(a->getModifiable() == true && a->getMarked() == true){
                for(int i=0; i<n; i++){
                    if(a->getID()==idsAbertos[i]){
                        this->weights[j] = 0.0;
//                            cout << "A{" <<a->getID() << "}" << endl;
                    }
                }
                j++;
            }

        }
    }
//    cout << "--------------------------------" << endl;
}